

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O0

Maybe<unsigned_long> __thiscall
kj::HashIndex<kj::HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*>::Callbacks>::
find<kj::HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*>::Entry,capnp::Type&>
          (HashIndex<kj::HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*>::Callbacks> *this,
          ArrayPtr<kj::HashMap<capnp::Type,_capnp::JsonCodec::HandlerBase_*>::Entry> table,
          Type *params)

{
  ArrayPtr<kj::HashMap<capnp::Type,_capnp::JsonCodec::HandlerBase_*>::Entry> table_00;
  bool bVar1;
  uint uVar2;
  size_t sVar3;
  Entry *e;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX_01;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar4;
  Entry *this_00;
  Type *in_R8;
  Maybe<unsigned_long> MVar5;
  ulong local_58;
  HashIndex<kj::HashMap<capnp::Type,_capnp::JsonCodec::HandlerBase_*>::Callbacks> *local_50;
  Entry *local_48;
  HashBucket *local_40;
  HashBucket *bucket;
  uint i;
  uint hashCode;
  Type *params_local;
  HashIndex<kj::HashMap<capnp::Type,_capnp::JsonCodec::HandlerBase_*>::Callbacks> *this_local;
  ArrayPtr<kj::HashMap<capnp::Type,_capnp::JsonCodec::HandlerBase_*>::Entry> table_local;
  
  this_local = (HashIndex<kj::HashMap<capnp::Type,_capnp::JsonCodec::HandlerBase_*>::Callbacks> *)
               table.size_;
  this_00 = table.ptr;
  _i = in_R8;
  params_local = &this_00->key;
  table_local.ptr = (Entry *)params;
  table_local.size_ = (size_t)this;
  sVar3 = Array<kj::_::HashBucket>::size((Array<kj::_::HashBucket> *)&this_00->value);
  if (sVar3 == 0) {
    Maybe<unsigned_long>::Maybe((Maybe<unsigned_long> *)this,(void *)0x0);
    aVar4 = extraout_RDX;
  }
  else {
    bVar1 = HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*>::Callbacks::hashCode<capnp::Type&>
                      ((Callbacks *)this_00,_i);
    bucket._4_4_ = (uint)bVar1;
    sVar3 = Array<kj::_::HashBucket>::size((Array<kj::_::HashBucket> *)&this_00->value);
    bucket._0_4_ = kj::_::chooseBucket((uint)bVar1,(uint)sVar3);
    while( true ) {
      local_40 = Array<kj::_::HashBucket>::operator[]
                           ((Array<kj::_::HashBucket> *)&this_00->value,(ulong)(uint)bucket);
      bVar1 = kj::_::HashBucket::isEmpty(local_40);
      if (bVar1) break;
      bVar1 = kj::_::HashBucket::isErased(local_40);
      if ((!bVar1) && (local_40->hash == bucket._4_4_)) {
        local_50 = this_local;
        local_48 = table_local.ptr;
        table_00.size_ = (size_t)table_local.ptr;
        table_00.ptr = (Entry *)this_local;
        e = kj::_::HashBucket::
            getRow<kj::HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*>::Entry>
                      (local_40,table_00);
        bVar1 = HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*>::Callbacks::
                matches<capnp::Type&>((Callbacks *)this_00,e,_i);
        if (bVar1) {
          uVar2 = kj::_::HashBucket::getPos(local_40);
          local_58 = (ulong)uVar2;
          Maybe<unsigned_long>::Maybe((Maybe<unsigned_long> *)this,&local_58);
          aVar4 = extraout_RDX_01;
          goto LAB_007494fd;
        }
      }
      sVar3 = kj::_::probeHash((Array<kj::_::HashBucket> *)&this_00->value,(ulong)(uint)bucket);
      bucket._0_4_ = (uint)sVar3;
    }
    Maybe<unsigned_long>::Maybe((Maybe<unsigned_long> *)this,(void *)0x0);
    aVar4 = extraout_RDX_00;
  }
LAB_007494fd:
  MVar5.ptr.field_1.value = aVar4.value;
  MVar5.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar5.ptr;
}

Assistant:

Maybe<size_t> find(kj::ArrayPtr<Row> table, Params&&... params) const {
    if (buckets.size() == 0) return nullptr;

    uint hashCode = cb.hashCode(params...);
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // not found.
        return nullptr;
      } else if (bucket.isErased()) {
        // skip, keep searching
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // found
        return size_t(bucket.getPos());
      }
    }
  }